

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O3

boolean empty_pipeline_output_buffer(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  size_t sVar2;
  
  pjVar1 = cinfo->dest;
  (**(code **)(*(long *)pjVar1[1].init_destination + 0x10))
            (pjVar1[1].init_destination,pjVar1[1].next_output_byte,pjVar1[1].free_in_buffer);
  sVar2 = pjVar1[1].free_in_buffer;
  pjVar1->next_output_byte = pjVar1[1].next_output_byte;
  pjVar1->free_in_buffer = sVar2;
  return 1;
}

Assistant:

static boolean
empty_pipeline_output_buffer(j_compress_ptr cinfo)
{
    QTC::TC("libtests", "Pl_DCT empty_pipeline_output_buffer");
    auto* dest = reinterpret_cast<dct_pipeline_dest*>(cinfo->dest);
    dest->next->write(dest->buffer, dest->size);
    dest->pub.next_output_byte = dest->buffer;
    dest->pub.free_in_buffer = dest->size;
    return TRUE;
}